

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation_node.cpp
# Opt level: O3

void __thiscall
duckdb::SetOperationNode::SetOperationNode
          (SetOperationNode *this,SetOperationType setop_type,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *left,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *right,
          vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
          *children,bool setop_all)

{
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *puVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  pointer __p;
  reference pvVar4;
  reference args_2;
  pointer puVar5;
  SerializationException *pSVar6;
  pointer puVar7;
  size_type sVar8;
  size_type __n;
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
  empty_children;
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
  new_children;
  SetOperationType local_92;
  bool local_91;
  SetOperationNode *local_90;
  QueryNode *local_88;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_80;
  string local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  pointer local_48;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *local_38;
  
  local_92 = setop_type;
  local_91 = setop_all;
  QueryNode::QueryNode(&this->super_QueryNode,SET_OPERATION_NODE);
  (this->super_QueryNode)._vptr_QueryNode = (_func_int **)&PTR__SetOperationNode_0243b6c8;
  this->setop_type = setop_type;
  this->setop_all = setop_all;
  puVar1 = &this->left;
  (this->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  (this->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (left->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  local_90 = this;
  if ((_Var2._M_head_impl == (QueryNode *)0x0) ||
     ((right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0)) {
    if ((long)(children->
              super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(children->
              super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x10) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
               ::operator[](children,0);
      _Var2._M_head_impl =
           (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
           .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      _Var3._M_head_impl =
           (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
           .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var3._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
      }
      pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
               ::operator[](children,1);
      _Var2._M_head_impl =
           (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
           .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      _Var3._M_head_impl =
           (local_90->right).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (local_90->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
      ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var3._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
      }
    }
    puVar5 = (children->
             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (children->
             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar7 - (long)puVar5) < 9) {
      pSVar6 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"Set Operation requires at least 2 children","");
      SerializationException::SerializationException(pSVar6,&local_78);
      __cxa_throw(pSVar6,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_38 = puVar1;
    if (local_92 != UNION) {
      pSVar6 = (SerializationException *)__cxa_allocate_exception(0x10);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 "Multiple children in set-operations are only supported for UNION","");
      SerializationException::SerializationException(pSVar6,&local_78);
      __cxa_throw(pSVar6,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0x10 < (ulong)((long)puVar7 - (long)puVar5)) {
      do {
        local_58 = 0;
        uStack_50 = 0;
        local_48 = (pointer)0x0;
        if ((long)puVar7 - (long)puVar5 == 0) {
          local_48 = (pointer)0x0;
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          uStack_50._0_4_ = 0;
          uStack_50._4_4_ = 0;
        }
        else {
          sVar8 = (long)puVar7 - (long)puVar5 >> 3;
          __n = 0;
          do {
            if (__n + 1 == sVar8) {
              pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                       ::operator[](children,__n);
              ::std::
              vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
                          *)&local_58,pvVar4);
            }
            else {
              local_78._M_dataplus._M_p = (pointer)0x0;
              local_78._M_string_length = 0;
              local_78.field_2._M_allocated_capacity = 0;
              pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                       ::operator[](children,__n);
              args_2 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                       ::operator[](children,__n + 1);
              make_uniq<duckdb::SetOperationNode,duckdb::SetOperationType&,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,true>,bool&>
                        ((duckdb *)&local_88,&local_92,pvVar4,args_2,
                         (vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
                          *)&local_78,&local_91);
              local_80._M_head_impl = local_88;
              local_88 = (QueryNode *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,std::allocator<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>>
                          *)&local_58,
                         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                          *)&local_80);
              if (local_80._M_head_impl != (QueryNode *)0x0) {
                (*(local_80._M_head_impl)->_vptr_QueryNode[1])();
              }
              if (local_88 != (QueryNode *)0x0) {
                (*local_88->_vptr_QueryNode[1])();
              }
              ::std::
              vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                         *)&local_78);
            }
            __n = __n + 2;
            puVar5 = (children->
                     super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar7 = (children->
                     super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar8 = (long)puVar7 - (long)puVar5 >> 3;
          } while (__n < sVar8);
        }
        local_78.field_2._M_allocated_capacity =
             (size_type)
             (children->
             super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(undefined4 *)
         &(children->
          super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (undefined4)local_58;
        *(undefined4 *)
         ((long)&(children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = local_58._4_4_;
        *(undefined4 *)
         &(children->
          super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (undefined4)uStack_50;
        *(undefined4 *)
         ((long)&(children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = uStack_50._4_4_;
        (children->
        super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = (pointer)0x0;
        local_78._M_dataplus._M_p = (pointer)puVar5;
        local_78._M_string_length = (size_type)puVar7;
        ::std::
        vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   *)&local_78);
        ::std::
        vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                   *)&local_58);
        puVar5 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar7 = (children->
                 super_vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (0x10 < (ulong)((long)puVar7 - (long)puVar5));
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
             ::operator[](children,0);
    _Var2._M_head_impl =
         (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var3._M_head_impl =
         (local_38->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
         _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (local_38->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var3._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
             ::operator[](children,1);
    _Var2._M_head_impl =
         (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pvVar4->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var3._M_head_impl =
         (local_90->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (local_90->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var3._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    }
  }
  else {
    (left->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var3._M_head_impl =
         (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (puVar1->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var3._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    }
    _Var2._M_head_impl =
         (right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (right->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var3._M_head_impl =
         (local_90->right).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (local_90->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var3._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
      return;
    }
  }
  return;
}

Assistant:

SetOperationNode::SetOperationNode(SetOperationType setop_type, unique_ptr<QueryNode> left, unique_ptr<QueryNode> right,
                                   vector<unique_ptr<QueryNode>> children, bool setop_all)
    : QueryNode(QueryNodeType::SET_OPERATION_NODE), setop_type(setop_type), setop_all(setop_all) {
	if (left && right) {
		// simple case - left/right are supplied
		this->left = std::move(left);
		this->right = std::move(right);
		return;
	}
	if (children.size() == 2) {
		this->left = std::move(children[0]);
		this->right = std::move(children[1]);
	}
	// we have multiple children - we need to construct a tree of set operation nodes
	if (children.size() <= 1) {
		throw SerializationException("Set Operation requires at least 2 children");
	}
	if (setop_type != SetOperationType::UNION) {
		throw SerializationException("Multiple children in set-operations are only supported for UNION");
	}
	// construct a balanced tree from the union
	while (children.size() > 2) {
		vector<unique_ptr<QueryNode>> new_children;
		for (idx_t i = 0; i < children.size(); i += 2) {
			if (i + 1 == children.size()) {
				new_children.push_back(std::move(children[i]));
			} else {
				vector<unique_ptr<QueryNode>> empty_children;
				auto setop_node =
				    make_uniq<SetOperationNode>(setop_type, std::move(children[i]), std::move(children[i + 1]),
				                                std::move(empty_children), setop_all);
				new_children.push_back(std::move(setop_node));
			}
		}
		children = std::move(new_children);
	}
	// two children left - fill in the left/right of this node
	this->left = std::move(children[0]);
	this->right = std::move(children[1]);
}